

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallPtrSet.cpp
# Opt level: O1

void __thiscall
llvm::SmallPtrSetImplBase::CopyHelper(SmallPtrSetImplBase *this,SmallPtrSetImplBase *RHS)

{
  uint *puVar1;
  
  this->CurArraySize = RHS->CurArraySize;
  puVar1 = &RHS->CurArraySize;
  if (RHS->CurArray == RHS->SmallArray) {
    puVar1 = &RHS->NumNonEmpty;
  }
  if (*puVar1 != 0) {
    memmove(this->CurArray,RHS->CurArray,(ulong)*puVar1 << 3);
  }
  this->NumNonEmpty = RHS->NumNonEmpty;
  this->NumTombstones = RHS->NumTombstones;
  return;
}

Assistant:

void SmallPtrSetImplBase::CopyHelper(const SmallPtrSetImplBase &RHS) {
  // Copy over the new array size
  CurArraySize = RHS.CurArraySize;

  // Copy over the contents from the other set
  std::copy(RHS.CurArray, RHS.EndPointer(), CurArray);

  NumNonEmpty = RHS.NumNonEmpty;
  NumTombstones = RHS.NumTombstones;
}